

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O3

int Gia_ManCountNonConst0(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar1 = p->vCos->nSize;
  uVar3 = uVar1 - p->nRegs;
  if (uVar3 == 0 || (int)uVar1 < p->nRegs) {
    iVar4 = 0;
  }
  else {
    uVar6 = 0;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar6;
    }
    iVar4 = 0;
    do {
      if (uVar5 == uVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = p->vCos->pArray[uVar6];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return iVar4;
      }
      uVar1 = *(uint *)(p->pObjs + iVar2);
      uVar7 = iVar2 - (uVar1 & 0x1fffffff);
      if ((int)uVar7 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      iVar4 = iVar4 + (uint)((uVar7 & 0x7fffffff) != 0 || (uVar1 >> 0x1d & 1) != 0);
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  return iVar4;
}

Assistant:

int Gia_ManCountNonConst0( Gia_Man_t * p )
{ 
    Gia_Obj_t * pObj;
    int i, Count = 0;
    Gia_ManForEachPo( p, pObj, i )
        Count += (Gia_ObjFaninLit0p(p, pObj) != 0);
    return Count;
}